

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O3

void __thiscall SimpleParallelAnalyzer::SetupResults(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerResults *pSVar1;
  SimpleParallelAnalyzerResults *this_00;
  
  this_00 = (SimpleParallelAnalyzerResults *)operator_new(0x20);
  SimpleParallelAnalyzerResults::SimpleParallelAnalyzerResults
            (this_00,this,
             (this->mSettings)._M_t.
             super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
             .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl);
  pSVar1 = (this->mResults)._M_t.
           super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
           ._M_t.
           super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
           .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
  ._M_t.
  super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
  .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl = this_00;
  if (pSVar1 != (SimpleParallelAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn
            ((Channel *)
             (this->mResults)._M_t.
             super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
             ._M_t.
             super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
             .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl);
  return;
}

Assistant:

void SimpleParallelAnalyzer::SetupResults()
{
    mResults.reset( new SimpleParallelAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mClockChannel );
}